

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chunk.cpp
# Opt level: O0

vector<char,_std::allocator<char>_> * __thiscall Chunk::serialize(Chunk *this)

{
  bool bVar1;
  uint32_t uVar2;
  char *pcVar3;
  size_type in_RSI;
  allocator_type *in_RDI;
  uint32_t tileSwapped;
  uint i;
  vector<char,_std::allocator<char>_> *data;
  Chunk *in_stack_ffffffffffffffb0;
  allocator_type *__a;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint local_28;
  allocator<char> local_12;
  undefined1 local_11;
  
  __a = in_RDI;
  bVar1 = isEmpty(in_stack_ffffffffffffffb0);
  if (bVar1) {
    memset(in_RDI,0,0x18);
    Catch::clara::std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)0x27221b);
  }
  else {
    local_11 = 0;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_RSI,__a);
    std::allocator<char>::~allocator(&local_12);
    for (local_28 = 0; local_28 < 0x400; local_28 = local_28 + 1) {
      uVar2 = FileStorage::byteswap<unsigned_int,_true>(*(uint32_t *)(in_RSI + (ulong)local_28 * 4))
      ;
      pcVar3 = Catch::clara::std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)0x272285);
      *(uint32_t *)(pcVar3 + (ulong)local_28 * 4) = uVar2;
    }
  }
  return (vector<char,_std::allocator<char>_> *)__a;
}

Assistant:

std::vector<char> Chunk::serialize() const {
    if (isEmpty()) {
        return {};
    }
    std::vector<char> data(sizeof(tiles_));
    for (unsigned int i = 0; i < WIDTH * WIDTH; ++i) {
        // FIXME: it may be just as efficient to create tileSwapped with bitwise ops instead of relying on a fragile reinterpret cast (which could be platform dependent).
        uint32_t tileSwapped = FileStorage::byteswap(*reinterpret_cast<const uint32_t*>(tiles_ + i));
        std::memcpy(data.data() + i * sizeof(TileData), &tileSwapped, sizeof(TileData));
    }
    return data;
}